

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

Gia_Man_t * Mf_ManDeriveMapping(Mf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  int *pCut_00;
  int *pCut;
  int k;
  int i;
  Vec_Int_t *vMapping;
  Mf_Man_t *p_local;
  
  if ((p->pPars->fCutMin == 0) && (p->pGia->vMapping == (Vec_Int_t *)0x0)) {
    iVar1 = Gia_ManObjNum(p->pGia);
    p_00 = Vec_IntAlloc(iVar1 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
    iVar1 = Gia_ManObjNum(p->pGia);
    Vec_IntFill(p_00,iVar1,0);
    for (pCut._4_4_ = 0; pCut._4_4_ < p->pGia->nObjs; pCut._4_4_ = pCut._4_4_ + 1) {
      pObj = Gia_ManObj(p->pGia,pCut._4_4_);
      iVar1 = Gia_ObjIsAnd(pObj);
      if ((iVar1 != 0) && (iVar1 = Mf_ObjMapRefNum(p,pCut._4_4_), iVar1 != 0)) {
        pCut_00 = Mf_ObjCutBest(p,pCut._4_4_);
        iVar1 = Vec_IntSize(p_00);
        Vec_IntWriteEntry(p_00,pCut._4_4_,iVar1);
        iVar1 = Mf_CutSize(pCut_00);
        Vec_IntPush(p_00,iVar1);
        for (pCut._0_4_ = 1; iVar1 = Mf_CutSize(pCut_00), (int)pCut <= iVar1;
            pCut._0_4_ = (int)pCut + 1) {
          Vec_IntPush(p_00,pCut_00[(int)pCut]);
        }
        Vec_IntPush(p_00,pCut._4_4_);
      }
    }
    iVar1 = Vec_IntCap(p_00);
    if (iVar1 != 0x10) {
      iVar1 = Vec_IntSize(p_00);
      iVar2 = Vec_IntCap(p_00);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                      ,0x4a3,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
      }
    }
    p->pGia->vMapping = p_00;
    return p->pGia;
  }
  __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                ,0x495,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
}

Assistant:

Gia_Man_t * Mf_ManDeriveMapping( Mf_Man_t * p )
{
    Vec_Int_t * vMapping;
    int i, k, * pCut;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Mf_CutSize(pCut) );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, pCut[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}